

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O0

string * libcellml::decompressMathMLDTD_abi_cxx11_(void)

{
  reference pvVar1;
  string *in_RDI;
  allocator<char> local_59;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  uchar *local_48;
  uchar *a;
  undefined8 local_30;
  uLong sizeMathmlDTDUncompressedResize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mathmlDTD;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &sizeMathmlDTDUncompressedResize);
  local_30 = 0x5f8a8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &sizeMathmlDTDUncompressedResize,0x5f8a8);
  local_48 = compressedMathMLDTD();
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &sizeMathmlDTDUncompressedResize,0);
  uncompress(pvVar1,&local_30,local_48,0x108a8);
  local_50._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &sizeMathmlDTDUncompressedResize);
  local_58._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &sizeMathmlDTDUncompressedResize);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((string *)in_RDI,local_50,local_58,&local_59);
  std::allocator<char>::~allocator(&local_59);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &sizeMathmlDTDUncompressedResize);
  return in_RDI;
}

Assistant:

std::string decompressMathMLDTD()
{
    std::vector<unsigned char> mathmlDTD;
    uLong sizeMathmlDTDUncompressedResize = MATHML_DTD_LEN;
    mathmlDTD.resize(sizeMathmlDTDUncompressedResize);

    const unsigned char *a = compressedMathMLDTD();

    uncompress(&mathmlDTD[0], &sizeMathmlDTDUncompressedResize, a, COMPRESSED_MATHML_DTD_LEN);

    return std::string(mathmlDTD.begin(), mathmlDTD.end());
}